

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_MonsterRefire
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int pos;
  AActor *pAVar1;
  PClass *pPVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FState *val;
  char *pcVar7;
  AActor *self;
  bool bVar8;
  bool bVar9;
  PClass *pPVar6;
  PClassActor *cls;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003da2e6;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003da2d6:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003da2e6:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123a,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003da197;
    pPVar6 = (self->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar3 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar3);
      (self->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar8 = pPVar6 == (PClass *)0x0;
    bVar9 = !bVar8;
    defaultparam = (TArray<VMValue,_VMValue> *)
                   CONCAT71((int7)((ulong)defaultparam >> 8),pPVar6 == pPVar2 || bVar8);
    if (pPVar6 != pPVar2 && !bVar8) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar2) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003da2e6;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003da2d6;
LAB_003da197:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar7 = "(paramnum) < numparam";
LAB_003da30e:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123b,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar7 = "param[paramnum].Type == REGT_INT";
    goto LAB_003da30e;
  }
  if (numparam < 3) {
    pcVar7 = "(paramnum) < numparam";
LAB_003da336:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x123c,
                  "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar7 = "param[paramnum].Type == REGT_INT";
    goto LAB_003da336;
  }
  iVar3 = param[1].field_0.i;
  pos = param[2].field_0.i;
  cls = (PClassActor *)(self->super_DThinker).super_DObject.Class;
  if (cls == (PClassActor *)0x0) {
    iVar4 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self,defaultparam);
    cls = (PClassActor *)CONCAT44(extraout_var_00,iVar4);
    (self->super_DThinker).super_DObject.Class = (PClass *)cls;
  }
  val = FStateLabelStorage::GetState(&StateLabels,pos,cls,false);
  A_FaceTarget(self);
  uVar5 = FRandom::GenRand32(&pr_monsterrefire);
  if ((int)(uVar5 & 0xff) < iVar3) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1242,
                    "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
LAB_003da228:
    val = (FState *)0x0;
LAB_003da2ac:
    VMReturn::SetPointer(ret,val,0);
    iVar3 = 1;
  }
  else {
    pAVar1 = (self->target).field_0.p;
    if (pAVar1 == (AActor *)0x0) {
LAB_003da29f:
      if (0 < numret) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1249,
                        "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        goto LAB_003da2ac;
      }
    }
    else {
      if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (self->target).field_0.p = (AActor *)0x0;
        goto LAB_003da29f;
      }
      bVar9 = P_HitFriend(self);
      if (((bVar9) || (pAVar1 = (self->target).field_0.p, pAVar1->health < 1)) ||
         (bVar9 = P_CheckSight(self,pAVar1,6), !bVar9)) goto LAB_003da29f;
      if (0 < numret) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x124b,
                        "int AF_AActor_A_MonsterRefire(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        goto LAB_003da228;
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MonsterRefire)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT	(prob);
	PARAM_STATE	(jump);

	A_FaceTarget(self);

	if (pr_monsterrefire() < prob)
	{
		ACTION_RETURN_STATE(NULL);
	}
	if (self->target == NULL
		|| P_HitFriend (self)
		|| self->target->health <= 0
		|| !P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING|SF_SEEPASTSHOOTABLELINES) )
	{
		ACTION_RETURN_STATE(jump);
	}
	ACTION_RETURN_STATE(NULL);
}